

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
::reset_growth_left(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                    *this)

{
  ulong uVar1;
  
  uVar1 = this->capacity_;
  if ((uVar1 != 0) && ((uVar1 + 1 & uVar1) == 0)) {
    (this->settings_).
    super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_0UL,_false>
    .value = uVar1 - ((uVar1 >> 3) + this->size_);
    return;
  }
  __assert_fail("IsValidCapacity(capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x1d5,"size_t phmap::container_internal::CapacityToGrowth(size_t)");
}

Assistant:

size_t capacity() const { return capacity_; }